

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O0

void __thiscall
btStridingMeshInterface::InternalProcessAllTriangles
          (btStridingMeshInterface *this,btInternalTriangleIndexCallback *callback,
          btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  double dVar2;
  btVector3 *pbVar3;
  btScalar *pbVar4;
  long *in_RSI;
  btStridingMeshInterface *in_RDI;
  uchar *tri_indices_5;
  unsigned_short *tri_indices_4;
  uint *tri_indices_3;
  double *graphicsbase_1;
  uchar *tri_indices_2;
  unsigned_short *tri_indices_1;
  uint *tri_indices;
  float *graphicsbase;
  btVector3 meshScaling;
  btVector3 triangle [3];
  int gfxindex;
  int numtriangles;
  int numverts;
  int stride;
  PHY_ScalarType gfxindextype;
  PHY_ScalarType type;
  int indexstride;
  uchar *indexbase;
  uchar *vertexbase;
  int graphicssubparts;
  int part;
  int numtotalphysicsverts;
  btVector3 *local_1e0;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  byte *local_1b0;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  ushort *local_180;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  int *local_150;
  double *local_148;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  float local_120;
  float local_11c;
  byte *local_118;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  ushort *local_e8;
  float local_dc;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  float local_c0;
  float local_bc;
  int *local_b8;
  float *local_b0;
  btVector3 local_a8;
  btVector3 local_98;
  btVector3 bStack_88;
  btVector3 bStack_78;
  btVector3 bStack_68;
  int local_58;
  undefined1 local_54 [4];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  int local_2c;
  uint local_28;
  int local_24;
  long *local_10;
  
  local_24 = 0;
  local_10 = in_RSI;
  local_2c = (*in_RDI->_vptr_btStridingMeshInterface[7])();
  local_1e0 = &local_98;
  do {
    btVector3::btVector3(local_1e0);
    local_1e0 = local_1e0 + 1;
  } while (local_1e0 != &bStack_68);
  pbVar3 = getScaling(in_RDI);
  local_a8.m_floats._0_8_ = *(undefined8 *)pbVar3->m_floats;
  local_a8.m_floats._8_8_ = *(undefined8 *)(pbVar3->m_floats + 2);
  for (local_28 = 0; (int)local_28 < local_2c; local_28 = local_28 + 1) {
    (*in_RDI->_vptr_btStridingMeshInterface[4])
              (in_RDI,&local_38,local_54,&local_48,&local_50,&local_40,&local_44,&local_58,&local_4c
               ,local_28);
    local_24 = local_24 + local_58 * 3;
    if (local_48 == 0) {
      if (local_4c == 2) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_b8 = (int *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_b0 = (float *)(local_38 + (ulong)(uint)(*local_b8 * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_bc = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_c0 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_c4 = fVar1 * *pbVar4;
          btVector3::setValue(&local_98,&local_bc,&local_c0,&local_c4);
          local_b0 = (float *)(local_38 + (ulong)(uint)(local_b8[1] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_c8 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_cc = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_d0 = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_c8,&local_cc,&local_d0);
          local_b0 = (float *)(local_38 + (ulong)(uint)(local_b8[2] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_d4 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_d8 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_dc = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_d4,&local_d8,&local_dc);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
      else if (local_4c == 3) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_e8 = (ushort *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_b0 = (float *)(local_38 + (int)((uint)*local_e8 * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_ec = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_f0 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_f4 = fVar1 * *pbVar4;
          btVector3::setValue(&local_98,&local_ec,&local_f0,&local_f4);
          local_b0 = (float *)(local_38 + (int)((uint)local_e8[1] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_f8 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_fc = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_100 = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_f8,&local_fc,&local_100);
          local_b0 = (float *)(local_38 + (int)((uint)local_e8[2] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_104 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_108 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_10c = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_104,&local_108,&local_10c);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
      else if (local_4c == 5) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_118 = (byte *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_b0 = (float *)(local_38 + (int)((uint)*local_118 * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_11c = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_120 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_124 = fVar1 * *pbVar4;
          btVector3::setValue(&local_98,&local_11c,&local_120,&local_124);
          local_b0 = (float *)(local_38 + (int)((uint)local_118[1] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_128 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_12c = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_130 = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_128,&local_12c,&local_130);
          local_b0 = (float *)(local_38 + (int)((uint)local_118[2] * local_50));
          fVar1 = *local_b0;
          pbVar4 = btVector3::getX(&local_a8);
          local_134 = fVar1 * *pbVar4;
          fVar1 = local_b0[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_138 = fVar1 * *pbVar4;
          fVar1 = local_b0[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_13c = fVar1 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_134,&local_138,&local_13c);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
    }
    else if (local_48 == 1) {
      if (local_4c == 2) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_150 = (int *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_148 = (double *)(local_38 + (ulong)(uint)(*local_150 * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_154 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_158 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_15c = (float)dVar2 * *pbVar4;
          btVector3::setValue(&local_98,&local_154,&local_158,&local_15c);
          local_148 = (double *)(local_38 + (ulong)(uint)(local_150[1] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_160 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_164 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_168 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_160,&local_164,&local_168);
          local_148 = (double *)(local_38 + (ulong)(uint)(local_150[2] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_16c = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_170 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_174 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_16c,&local_170,&local_174);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
      else if (local_4c == 3) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_180 = (ushort *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_148 = (double *)(local_38 + (int)((uint)*local_180 * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_184 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_188 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_18c = (float)dVar2 * *pbVar4;
          btVector3::setValue(&local_98,&local_184,&local_188,&local_18c);
          local_148 = (double *)(local_38 + (int)((uint)local_180[1] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_190 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_194 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_198 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_190,&local_194,&local_198);
          local_148 = (double *)(local_38 + (int)((uint)local_180[2] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_19c = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_1a0 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_1a4 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_19c,&local_1a0,&local_1a4);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
      else if (local_4c == 5) {
        for (bStack_68.m_floats[3] = 0.0; (int)bStack_68.m_floats[3] < local_58;
            bStack_68.m_floats[3] = (btScalar)((int)bStack_68.m_floats[3] + 1)) {
          local_1b0 = (byte *)(local_40 + (int)bStack_68.m_floats[3] * local_44);
          local_148 = (double *)(local_38 + (int)((uint)*local_1b0 * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_1b4 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_1b8 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_1bc = (float)dVar2 * *pbVar4;
          btVector3::setValue(&local_98,&local_1b4,&local_1b8,&local_1bc);
          local_148 = (double *)(local_38 + (int)((uint)local_1b0[1] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_1c0 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_1c4 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_1c8 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_88,&local_1c0,&local_1c4,&local_1c8);
          local_148 = (double *)(local_38 + (int)((uint)local_1b0[2] * local_50));
          dVar2 = *local_148;
          pbVar4 = btVector3::getX(&local_a8);
          local_1cc = (float)dVar2 * *pbVar4;
          dVar2 = local_148[1];
          pbVar4 = btVector3::getY(&local_a8);
          local_1d0 = (float)dVar2 * *pbVar4;
          dVar2 = local_148[2];
          pbVar4 = btVector3::getZ(&local_a8);
          local_1d4 = (float)dVar2 * *pbVar4;
          btVector3::setValue(&bStack_78,&local_1cc,&local_1d0,&local_1d4);
          (**(code **)(*local_10 + 0x10))(local_10,&local_98,local_28,bStack_68.m_floats[3]);
        }
      }
    }
    (*in_RDI->_vptr_btStridingMeshInterface[6])(in_RDI,(ulong)local_28);
  }
  return;
}

Assistant:

void	btStridingMeshInterface::InternalProcessAllTriangles(btInternalTriangleIndexCallback* callback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	(void)aabbMin;
	(void)aabbMax;
	int numtotalphysicsverts = 0;
	int part,graphicssubparts = getNumSubParts();
	const unsigned char * vertexbase;
	const unsigned char * indexbase;
	int indexstride;
	PHY_ScalarType type;
	PHY_ScalarType gfxindextype;
	int stride,numverts,numtriangles;
	int gfxindex;
	btVector3 triangle[3];

	btVector3 meshScaling = getScaling();

	///if the number of parts is big, the performance might drop due to the innerloop switch on indextype
	for (part=0;part<graphicssubparts ;part++)
	{
		getLockedReadOnlyVertexIndexBase(&vertexbase,numverts,type,stride,&indexbase,indexstride,numtriangles,gfxindextype,part);
		numtotalphysicsverts+=numtriangles*3; //upper bound

		///unlike that developers want to pass in double-precision meshes in single-precision Bullet build
		///so disable this feature by default
		///see patch http://code.google.com/p/bullet/issues/detail?id=213

		switch (type)
		{
		case PHY_FLOAT:
		 {

			 float* graphicsbase;

			 switch (gfxindextype)
			 {
			 case PHY_INTEGER:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 case PHY_SHORT:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			case PHY_UCHAR:
				 {
					 for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
					 {
						 unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
						 graphicsbase = (float*)(vertexbase+tri_indices[0]*stride);
						 triangle[0].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[1]*stride);
						 triangle[1].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 graphicsbase = (float*)(vertexbase+tri_indices[2]*stride);
						 triangle[2].setValue(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),	graphicsbase[2]*meshScaling.getZ());
						 callback->internalProcessTriangleIndex(triangle,part,gfxindex);
					 }
					 break;
				 }
			 default:
				 btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
			 }
			 break;
		 }

		case PHY_DOUBLE:
			{
				double* graphicsbase;

				switch (gfxindextype)
				{
				case PHY_INTEGER:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned int* tri_indices= (unsigned int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_SHORT:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned short int* tri_indices= (unsigned short int*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				case PHY_UCHAR:
					{
						for (gfxindex=0;gfxindex<numtriangles;gfxindex++)
						{
							unsigned char* tri_indices= (unsigned char*)(indexbase+gfxindex*indexstride);
							graphicsbase = (double*)(vertexbase+tri_indices[0]*stride);
							triangle[0].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),(btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[1]*stride);
							triangle[1].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							graphicsbase = (double*)(vertexbase+tri_indices[2]*stride);
							triangle[2].setValue((btScalar)graphicsbase[0]*meshScaling.getX(),(btScalar)graphicsbase[1]*meshScaling.getY(),  (btScalar)graphicsbase[2]*meshScaling.getZ());
							callback->internalProcessTriangleIndex(triangle,part,gfxindex);
						}
						break;
					}
				default:
					btAssert((gfxindextype == PHY_INTEGER) || (gfxindextype == PHY_SHORT));
				}
				break;
			}
		default:
			btAssert((type == PHY_FLOAT) || (type == PHY_DOUBLE));
		}

		unLockReadOnlyVertexBase(part);
	}
}